

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O0

void Tim_ManSetCoRequired(Tim_Man_t *p,int iCo,float Delay)

{
  float Delay_local;
  int iCo_local;
  Tim_Man_t *p_local;
  
  if (p->nCos <= iCo) {
    __assert_fail("iCo < p->nCos",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timTime.c"
                  ,0x9c,"void Tim_ManSetCoRequired(Tim_Man_t *, int, float)");
  }
  if (((p->fUseTravId != 0) && (p->nTravIds != 0)) && (p->pCos[iCo].TravId == p->nTravIds)) {
    __assert_fail("!p->fUseTravId || !p->nTravIds || p->pCos[iCo].TravId != p->nTravIds",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timTime.c"
                  ,0x9d,"void Tim_ManSetCoRequired(Tim_Man_t *, int, float)");
  }
  p->pCos[iCo].timeReq = Delay;
  p->pCos[iCo].TravId = p->nTravIds;
  return;
}

Assistant:

void Tim_ManSetCoRequired( Tim_Man_t * p, int iCo, float Delay )
{
    assert( iCo < p->nCos );
    assert( !p->fUseTravId || !p->nTravIds || p->pCos[iCo].TravId != p->nTravIds );
    p->pCos[iCo].timeReq = Delay;
    p->pCos[iCo].TravId = p->nTravIds;
}